

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionKernel
          (ValidationState_t *_,Instruction *inst,uint32_t version)

{
  pointer pEVar1;
  bool bVar2;
  uint uVar3;
  uint id;
  int iVar4;
  Op OVar5;
  Instruction *pIVar6;
  uint *puVar7;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar8;
  _Base_ptr p_Var9;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *pvVar10;
  Instruction *in_RCX;
  long lVar11;
  spv_result_t sVar12;
  char *pcVar13;
  EntryPointDescription *desc;
  pointer pEVar14;
  ulong uVar15;
  string inst_name;
  string name_str;
  string local_250;
  pointer local_230;
  string local_228;
  DiagnosticStream local_208;
  
  (anonymous_namespace)::ReflectionInstructionName_abi_cxx11_
            (&local_250,(_anonymous_namespace_ *)_,
             (ValidationState_t *)
             (ulong)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[4],in_RCX);
  uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,4);
  pIVar6 = ValidationState_t::FindDef(_,uVar3);
  if ((pIVar6->inst_).opcode == 0x36) {
    for (puVar7 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar7 != (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_finish; puVar7 = puVar7 + 1) {
      if (*puVar7 == uVar3) {
        psVar8 = ValidationState_t::GetExecutionModels(_,uVar3);
        if ((psVar8 != (set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                        *)0x0) && ((psVar8->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0))
        {
          p_Var9 = (psVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          goto LAB_002dc53d;
        }
        break;
      }
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,local_250._M_dataplus._M_p,local_250._M_string_length);
    pcVar13 = " does not reference an entry-point";
    lVar11 = 0x22;
  }
  else {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,local_250._M_dataplus._M_p,local_250._M_string_length);
    pcVar13 = " does not reference a function";
    lVar11 = 0x1e;
  }
LAB_002dc590:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar13,lVar11);
  DiagnosticStream::~DiagnosticStream(&local_208);
  sVar12 = local_208.error_;
LAB_002dc5a7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  return sVar12;
LAB_002dc53d:
  if ((_Rb_tree_header *)p_Var9 == &(psVar8->_M_t)._M_impl.super__Rb_tree_header) goto LAB_002dc5d6;
  if (p_Var9[1]._M_color != 5) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,local_250._M_dataplus._M_p,local_250._M_string_length);
    pcVar13 = " must refer only to GLCompute entry-points";
    lVar11 = 0x2a;
    goto LAB_002dc590;
  }
  p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
  goto LAB_002dc53d;
LAB_002dc5d6:
  id = Instruction::GetOperandAs<unsigned_int>(inst,5);
  pIVar6 = ValidationState_t::FindDef(_,id);
  if ((pIVar6 != (Instruction *)0x0) && ((pIVar6->inst_).opcode == 7)) {
    Instruction::GetOperandAs<std::__cxx11::string>(&local_228,pIVar6,1);
    pvVar10 = ValidationState_t::entry_point_descriptions(_,uVar3);
    pEVar14 = (pvVar10->
              super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pEVar1 = (pvVar10->
             super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pEVar14 != pEVar1) {
      local_230 = local_228._M_dataplus._M_p;
      do {
        if (local_228._M_string_length == (pEVar14->name)._M_string_length) {
          if (local_228._M_string_length != 0) {
            iVar4 = bcmp(local_230,(pEVar14->name)._M_dataplus._M_p,local_228._M_string_length);
            if (iVar4 != 0) goto LAB_002dc661;
          }
          lVar11 = (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar15 = lVar11 >> 4;
          if ((version < 5) && (6 < uVar15)) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Version ",8);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208," of the ",8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_250._M_dataplus._M_p,local_250._M_string_length);
            pcVar13 = " instruction can only have 2 additional operands";
            lVar11 = 0x30;
            goto LAB_002dc68e;
          }
          sVar12 = SPV_SUCCESS;
          if (uVar15 < 7) goto LAB_002dc6a5;
          uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,6);
          bVar2 = IsUint32Constant(_,uVar3);
          if (!bVar2) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            pcVar13 = "NumArguments must be a 32-bit unsigned integer OpConstant";
            lVar11 = 0x39;
            goto LAB_002dc68e;
          }
          if (lVar11 == 0x70) goto LAB_002dc6a5;
          uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,7);
          bVar2 = IsUint32Constant(_,uVar3);
          if (!bVar2) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            pcVar13 = "Flags must be a 32-bit unsigned integer OpConstant";
            lVar11 = 0x32;
            goto LAB_002dc68e;
          }
          if (uVar15 < 9) goto LAB_002dc6a5;
          uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,8);
          OVar5 = ValidationState_t::GetIdOpcode(_,uVar3);
          sVar12 = SPV_SUCCESS;
          if (OVar5 == OpString) goto LAB_002dc6a5;
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar13 = "Attributes must be an OpString";
          lVar11 = 0x1e;
          goto LAB_002dc68e;
        }
LAB_002dc661:
        pEVar14 = pEVar14 + 1;
      } while (pEVar14 != pEVar1);
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    pcVar13 = "Name must match an entry-point for Kernel";
    lVar11 = 0x29;
LAB_002dc68e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar13,lVar11);
    DiagnosticStream::~DiagnosticStream(&local_208);
    sVar12 = local_208.error_;
LAB_002dc6a5:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    goto LAB_002dc5a7;
  }
  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
  pcVar13 = "Name must be an OpString";
  lVar11 = 0x18;
  goto LAB_002dc590;
}

Assistant:

spv_result_t ValidateClspvReflectionKernel(ValidationState_t& _,
                                           const Instruction* inst,
                                           uint32_t version) {
  const auto inst_name = ReflectionInstructionName(_, inst);
  const auto kernel_id = inst->GetOperandAs<uint32_t>(4);
  const auto kernel = _.FindDef(kernel_id);
  if (kernel->opcode() != spv::Op::OpFunction) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << inst_name << " does not reference a function";
  }

  bool found_kernel = false;
  for (auto entry_point : _.entry_points()) {
    if (entry_point == kernel_id) {
      found_kernel = true;
      break;
    }
  }
  if (!found_kernel) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << inst_name << " does not reference an entry-point";
  }

  const auto* exec_models = _.GetExecutionModels(kernel_id);
  if (!exec_models || exec_models->empty()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << inst_name << " does not reference an entry-point";
  }
  for (auto exec_model : *exec_models) {
    if (exec_model != spv::ExecutionModel::GLCompute) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << inst_name << " must refer only to GLCompute entry-points";
    }
  }

  auto name = _.FindDef(inst->GetOperandAs<uint32_t>(5));
  if (!name || name->opcode() != spv::Op::OpString) {
    return _.diag(SPV_ERROR_INVALID_ID, inst) << "Name must be an OpString";
  }

  const std::string name_str = name->GetOperandAs<std::string>(1);
  bool found = false;
  for (auto& desc : _.entry_point_descriptions(kernel_id)) {
    if (name_str == desc.name) {
      found = true;
      break;
    }
  }
  if (!found) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Name must match an entry-point for Kernel";
  }

  const auto num_operands = inst->operands().size();
  if (version < 5 && num_operands > 6) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Version " << version << " of the " << inst_name
           << " instruction can only have 2 additional operands";
  }

  if (num_operands > 6) {
    const auto num_args_id = inst->GetOperandAs<uint32_t>(6);
    if (!IsUint32Constant(_, num_args_id)) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NumArguments must be a 32-bit unsigned integer OpConstant";
    }
  }

  if (num_operands > 7) {
    const auto flags_id = inst->GetOperandAs<uint32_t>(7);
    if (!IsUint32Constant(_, flags_id)) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Flags must be a 32-bit unsigned integer OpConstant";
    }
  }

  if (num_operands > 8) {
    const auto atts_id = inst->GetOperandAs<uint32_t>(8);
    if (_.GetIdOpcode(atts_id) != spv::Op::OpString) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Attributes must be an OpString";
    }
  }

  return SPV_SUCCESS;
}